

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O0

void __thiscall Glucose::MultiSolvers::adjustNumberOfCores(MultiSolvers *this)

{
  long in_RDI;
  double dVar1;
  uint tmpnbsolvers;
  float mem;
  uint local_10;
  
  dVar1 = memUsed();
  if (*(int *)(in_RDI + 0x20) == 0) {
    if (0 < *(int *)(in_RDI + 0xa8)) {
      printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n"
             ,(ulong)*(uint *)(in_RDI + 0xa0),(ulong)*(uint *)(in_RDI + 0xa4));
    }
    local_10 = (uint)(long)((float)((uint)(*(int *)(in_RDI + 0xa0) << 2) / 10) / (float)dVar1);
    if (*(uint *)(in_RDI + 0xa4) < local_10) {
      local_10 = *(uint *)(in_RDI + 0xa4);
    }
    if (local_10 == 0) {
      local_10 = 1;
    }
    if (0 < *(int *)(in_RDI + 0xa8)) {
      printf("c |  One Solver is taking %.2fMb... Let\'s take %d solvers for this run (max 40%% of the maxmemory).       |\n"
             ,(double)(float)dVar1,(ulong)local_10);
    }
    *(uint *)(in_RDI + 0x24) = local_10;
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x24);
  }
  return;
}

Assistant:

void MultiSolvers::adjustNumberOfCores() {
    float mem = memUsed();
    if(nbthreads == 0) { // Automatic configuration
        if(verb >= 1)
            printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n", maxmemory, maxnbsolvers);
        unsigned int tmpnbsolvers = maxmemory * 4 / 10 / mem;
        if(tmpnbsolvers > maxnbsolvers) tmpnbsolvers = maxnbsolvers;
        if(tmpnbsolvers < 1) tmpnbsolvers = 1;
        if(verb >= 1)
            printf("c |  One Solver is taking %.2fMb... Let's take %d solvers for this run (max 40%% of the maxmemory).       |\n", mem, tmpnbsolvers);
        nbsolvers = tmpnbsolvers;
        nbthreads = nbsolvers;
    } else {
        assert(nbthreads == nbsolvers);
    }
}